

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_get_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  curl_off_t cVar1;
  CURLcode CVar2;
  ftp_conn *ftpc;
  long lStack_58;
  _Bool connected;
  long in;
  char *buf;
  char *bytes;
  curl_off_t size;
  connectdata *conn;
  FTP *ftp;
  ftpstate local_20;
  CURLcode result;
  ftpstate instate_local;
  int ftpcode_local;
  Curl_easy *data_local;
  
  ftp._4_4_ = CURLE_OK;
  conn = (connectdata *)(data->req).p.ftp;
  size = (curl_off_t)data->conn;
  local_20 = instate;
  result = ftpcode;
  _instate_local = data;
  if ((ftpcode == 0x96) || (ftpcode == 0x7d)) {
    bytes = (char *)0xffffffffffffffff;
    if ((instate == FTP_LIST) ||
       (((*(uint *)&(data->state).field_0x6d0 >> 0xf & 1) != 0 ||
        (0 < (long)(conn->bundle_node).ptr)))) {
      if (-1 < (long)(conn->bundle_node).ptr) {
        bytes = (char *)(conn->bundle_node).ptr;
      }
    }
    else {
      in = (long)(data->state).buffer;
      buf = strstr((char *)in," bytes");
      if (buf != (char *)0x0) {
        buf = buf + -1;
        lStack_58 = (long)buf - in;
        while( true ) {
          lStack_58 = lStack_58 + -1;
          if ((lStack_58 == 0) || (*buf == '(')) goto LAB_0095440a;
          if ((*buf < '0') || ('9' < *buf)) break;
          buf = buf + -1;
        }
        buf = (char *)0x0;
LAB_0095440a:
        if (buf != (char *)0x0) {
          buf = buf + 1;
          curlx_strtoofft(buf,(char **)0x0,0,(curl_off_t *)&bytes);
        }
      }
    }
    if (((_instate_local->req).maxdownload < (long)bytes) && (0 < (_instate_local->req).maxdownload)
       ) {
      bytes = (char *)(_instate_local->req).maxdownload;
      (_instate_local->req).size = (curl_off_t)bytes;
    }
    else if ((local_20 != FTP_LIST) &&
            ((*(uint *)&(_instate_local->state).field_0x6d0 >> 0xf & 1) != 0)) {
      bytes = (char *)0xffffffffffffffff;
    }
    Curl_infof(_instate_local,"Maxdownload = %ld",(_instate_local->req).maxdownload);
    if (local_20 != FTP_LIST) {
      Curl_infof(_instate_local,"Getting file with size: %ld",bytes);
    }
    *(ftpstate *)(size + 0x51c) = local_20;
    *(char **)(size + 0x520) = bytes;
    if ((*(ulong *)&(_instate_local->set).field_0x8e2 >> 10 & 1) == 0) {
      CVar2 = InitiateTransfer(_instate_local);
      return CVar2;
    }
    ftp._4_4_ = AllowServerConnect(_instate_local,(_Bool *)((long)&ftpc + 7));
    cVar1 = size;
    if (ftp._4_4_ != CURLE_OK) {
      return ftp._4_4_;
    }
    if ((ftpc._7_1_ & 1) == 0) {
      Curl_infof(_instate_local,"Data conn was not available immediately");
      _state(_instate_local,FTP_STOP);
      *(undefined1 *)(cVar1 + 0x4f5) = 1;
    }
  }
  else {
    if ((instate != FTP_LIST) || (ftpcode != 0x1c2)) {
      Curl_failf(data,"RETR response: %03d",(ulong)(uint)ftpcode);
      if (local_20 != FTP_RETR || result != 0x226) {
        return CURLE_FTP_COULDNT_RETR_FILE;
      }
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
    *(curl_pp_transfer *)&(conn->cnnct).outp = PPTRANSFER_NONE;
    _state(data,FTP_STOP);
  }
  return ftp._4_4_;
}

Assistant:

static CURLcode ftp_state_get_resp(struct Curl_easy *data,
                                   int ftpcode,
                                   ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;

  if((ftpcode == 150) || (ftpcode == 125)) {

    /*
      A;
      150 Opening BINARY mode data connection for /etc/passwd (2241
      bytes).  (ok, the file is being transferred)

      B:
      150 Opening ASCII mode data connection for /bin/ls

      C:
      150 ASCII data connection for /bin/ls (137.167.104.91,37445) (0 bytes).

      D:
      150 Opening ASCII mode data connection for [file] (0.0.0.0,0) (545 bytes)

      E:
      125 Data connection already open; Transfer starting. */

    curl_off_t size = -1; /* default unknown size */


    /*
     * It appears that there are FTP-servers that return size 0 for files when
     * SIZE is used on the file while being in BINARY mode. To work around
     * that (stupid) behavior, we attempt to parse the RETR response even if
     * the SIZE returned size zero.
     *
     * Debugging help from Salvatore Sorrentino on February 26, 2003.
     */

    if((instate != FTP_LIST) &&
       !data->state.prefer_ascii &&
       (ftp->downloadsize < 1)) {
      /*
       * It seems directory listings either don't show the size or very
       * often uses size 0 anyway. ASCII transfers may very well turn out
       * that the transferred amount of data is not the same as this line
       * tells, why using this number in those cases only confuses us.
       *
       * Example D above makes this parsing a little tricky */
      char *bytes;
      char *buf = data->state.buffer;
      bytes = strstr(buf, " bytes");
      if(bytes) {
        long in = (long)(--bytes-buf);
        /* this is a hint there is size information in there! ;-) */
        while(--in) {
          /* scan for the left parenthesis and break there */
          if('(' == *bytes)
            break;
          /* skip only digits */
          if(!ISDIGIT(*bytes)) {
            bytes = NULL;
            break;
          }
          /* one more estep backwards */
          bytes--;
        }
        /* if we have nothing but digits: */
        if(bytes) {
          ++bytes;
          /* get the number! */
          (void)curlx_strtoofft(bytes, NULL, 0, &size);
        }
      }
    }
    else if(ftp->downloadsize > -1)
      size = ftp->downloadsize;

    if(size > data->req.maxdownload && data->req.maxdownload > 0)
      size = data->req.size = data->req.maxdownload;
    else if((instate != FTP_LIST) && (data->state.prefer_ascii))
      size = -1; /* kludge for servers that understate ASCII mode file size */

    infof(data, "Maxdownload = %" CURL_FORMAT_CURL_OFF_T,
          data->req.maxdownload);

    if(instate != FTP_LIST)
      infof(data, "Getting file with size: %" CURL_FORMAT_CURL_OFF_T,
            size);

    /* FTP download: */
    conn->proto.ftpc.state_saved = instate;
    conn->proto.ftpc.retr_size_saved = size;

    if(data->set.ftp_use_port) {
      bool connected;

      result = AllowServerConnect(data, &connected);
      if(result)
        return result;

      if(!connected) {
        struct ftp_conn *ftpc = &conn->proto.ftpc;
        infof(data, "Data conn was not available immediately");
        state(data, FTP_STOP);
        ftpc->wait_data_conn = TRUE;
      }
    }
    else
      return InitiateTransfer(data);
  }
  else {
    if((instate == FTP_LIST) && (ftpcode == 450)) {
      /* simply no matching files in the dir listing */
      ftp->transfer = PPTRANSFER_NONE; /* don't download anything */
      state(data, FTP_STOP); /* this phase is over */
    }
    else {
      failf(data, "RETR response: %03d", ftpcode);
      return instate == FTP_RETR && ftpcode == 550?
        CURLE_REMOTE_FILE_NOT_FOUND:
        CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  return result;
}